

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.h
# Opt level: O0

Status * __thiscall leveldb::Status::operator=(Status *this,Status *rhs)

{
  char *local_30;
  Status *rhs_local;
  Status *this_local;
  
  if (this->state_ != rhs->state_) {
    if (this->state_ != (char *)0x0) {
      operator_delete__(this->state_);
    }
    if (rhs->state_ == (char *)0x0) {
      local_30 = (char *)0x0;
    }
    else {
      local_30 = CopyState(rhs->state_);
    }
    this->state_ = local_30;
  }
  return this;
}

Assistant:

inline Status& Status::operator=(const Status& rhs) {
  // The following condition catches both aliasing (when this == &rhs),
  // and the common case where both rhs and *this are ok.
  if (state_ != rhs.state_) {
    delete[] state_;
    state_ = (rhs.state_ == nullptr) ? nullptr : CopyState(rhs.state_);
  }
  return *this;
}